

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

bool __thiscall
cmLocalGenerator::GetRealDependency
          (cmLocalGenerator *this,string *inName,string *config,string *dep)

{
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *this_00;
  cmSourceFile *this_01;
  string *psVar3;
  string tLocation;
  string local_a8;
  string depLocation;
  string name;
  
  cmsys::SystemTools::GetFilenameName(&name,inName);
  if (name._M_string_length == 0) {
LAB_001d6a3b:
    bVar1 = false;
    goto LAB_001d6b84;
  }
  cmsys::SystemTools::GetFilenameLastExtension(&tLocation,&name);
  bVar1 = std::operator==(&tLocation,".exe");
  std::__cxx11::string::~string((string *)&tLocation);
  if (bVar1) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&tLocation,&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&tLocation);
    std::__cxx11::string::~string((string *)&tLocation);
  }
  this_00 = FindGeneratorTargetToUse(this,&name);
  if (this_00 == (cmGeneratorTarget *)0x0) {
LAB_001d6a42:
    bVar1 = cmsys::SystemTools::FileIsFullPath(inName);
    if (bVar1) {
      bVar1 = true;
      std::__cxx11::string::_M_assign((string *)dep);
      goto LAB_001d6b84;
    }
    this_01 = cmMakefile::GetSource(this->Makefile,inName,Ambiguous);
    if (this_01 != (cmSourceFile *)0x0) {
      cmSourceFile::ResolveFullPath(this_01,(string *)0x0,(string *)0x0);
      bVar1 = true;
      std::__cxx11::string::_M_assign((string *)dep);
      goto LAB_001d6b84;
    }
    psVar3 = GetCurrentSourceDirectory_abi_cxx11_(this);
    tLocation._M_string_length = (size_type)(psVar3->_M_dataplus)._M_p;
    tLocation._M_dataplus._M_p = (pointer)psVar3->_M_string_length;
    depLocation._M_dataplus._M_p = (pointer)0x1;
    depLocation.field_2._M_local_buf[0] = '/';
    depLocation._M_string_length = (size_type)&depLocation.field_2;
    cmStrCat<std::__cxx11::string>
              (&local_a8,(cmAlphaNum *)&tLocation,(cmAlphaNum *)&depLocation,inName);
    std::__cxx11::string::operator=((string *)dep,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    bVar1 = cmsys::SystemTools::FileExists(dep);
    if (!bVar1) {
      psVar3 = GetCurrentBinaryDirectory_abi_cxx11_(this);
      tLocation._M_string_length = (size_type)(psVar3->_M_dataplus)._M_p;
      tLocation._M_dataplus._M_p = (pointer)psVar3->_M_string_length;
      depLocation._M_dataplus._M_p = (pointer)0x1;
      depLocation.field_2._M_local_buf[0] = '/';
      depLocation._M_string_length = (size_type)&depLocation.field_2;
      cmStrCat<std::__cxx11::string>
                (&local_a8,(cmAlphaNum *)&tLocation,(cmAlphaNum *)&depLocation,inName);
      std::__cxx11::string::operator=((string *)dep,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    psVar3 = GetBinaryDirectory_abi_cxx11_(this);
    cmsys::SystemTools::CollapseFullPath(&tLocation,dep,psVar3);
LAB_001d6b71:
    std::__cxx11::string::operator=((string *)dep,(string *)&tLocation);
  }
  else {
    bVar1 = cmsys::SystemTools::FileIsFullPath(inName);
    if (!bVar1) {
LAB_001d6a02:
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (UNKNOWN_LIBRARY < TVar2) goto LAB_001d6a42;
      if ((0x10fU >> (TVar2 & 0x1f) & 1) == 0) goto LAB_001d6a3b;
      cmGeneratorTarget::GetFullPath(&tLocation,this_00,config,RuntimeBinaryArtifact,true);
      goto LAB_001d6b71;
    }
    tLocation._M_dataplus._M_p = (pointer)&tLocation.field_2;
    tLocation._M_string_length = 0;
    tLocation.field_2._M_local_buf[0] = '\0';
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if (-1 < (int)TVar2) {
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if ((int)TVar2 < 4) {
        cmGeneratorTarget::GetLocation(this_00,config);
        std::__cxx11::string::_M_assign((string *)&tLocation);
        cmsys::SystemTools::GetFilenamePath(&depLocation,&tLocation);
        std::__cxx11::string::operator=((string *)&tLocation,(string *)&depLocation);
        std::__cxx11::string::~string((string *)&depLocation);
        cmsys::SystemTools::CollapseFullPath(&depLocation,&tLocation);
        std::__cxx11::string::operator=((string *)&tLocation,(string *)&depLocation);
        std::__cxx11::string::~string((string *)&depLocation);
      }
    }
    std::__cxx11::string::string((string *)&local_a8,(string *)inName);
    cmsys::SystemTools::GetFilenamePath(&depLocation,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    cmsys::SystemTools::CollapseFullPath(&local_a8,&depLocation);
    std::__cxx11::string::operator=((string *)&depLocation,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    bVar1 = std::operator!=(&depLocation,&tLocation);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&depLocation);
      std::__cxx11::string::~string((string *)&tLocation);
      goto LAB_001d6a02;
    }
    std::__cxx11::string::_M_assign((string *)dep);
    std::__cxx11::string::~string((string *)&depLocation);
  }
  std::__cxx11::string::~string((string *)&tLocation);
  bVar1 = true;
LAB_001d6b84:
  std::__cxx11::string::~string((string *)&name);
  return bVar1;
}

Assistant:

bool cmLocalGenerator::GetRealDependency(const std::string& inName,
                                         const std::string& config,
                                         std::string& dep)
{
  // Older CMake code may specify the dependency using the target
  // output file rather than the target name.  Such code would have
  // been written before there was support for target properties that
  // modify the name so stripping down to just the file name should
  // produce the target name in this case.
  std::string name = cmSystemTools::GetFilenameName(inName);

  // If the input name is the empty string, there is no real
  // dependency. Short-circuit the other checks:
  if (name.empty()) {
    return false;
  }
  if (cmSystemTools::GetFilenameLastExtension(name) == ".exe") {
    name = cmSystemTools::GetFilenameWithoutLastExtension(name);
  }

  // Look for a CMake target with the given name.
  if (cmGeneratorTarget* target = this->FindGeneratorTargetToUse(name)) {
    // make sure it is not just a coincidence that the target name
    // found is part of the inName
    if (cmSystemTools::FileIsFullPath(inName)) {
      std::string tLocation;
      if (target->GetType() >= cmStateEnums::EXECUTABLE &&
          target->GetType() <= cmStateEnums::MODULE_LIBRARY) {
        tLocation = target->GetLocation(config);
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
      }
      std::string depLocation =
        cmSystemTools::GetFilenamePath(std::string(inName));
      depLocation = cmSystemTools::CollapseFullPath(depLocation);
      if (depLocation != tLocation) {
        // it is a full path to a depend that has the same name
        // as a target but is in a different location so do not use
        // the target as the depend
        dep = inName;
        return true;
      }
    }
    switch (target->GetType()) {
      case cmStateEnums::EXECUTABLE:
      case cmStateEnums::STATIC_LIBRARY:
      case cmStateEnums::SHARED_LIBRARY:
      case cmStateEnums::MODULE_LIBRARY:
      case cmStateEnums::UNKNOWN_LIBRARY:
        dep = target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact,
                                  /*realname=*/true);
        return true;
      case cmStateEnums::OBJECT_LIBRARY:
        // An object library has no single file on which to depend.
        // This was listed to get the target-level dependency.
      case cmStateEnums::INTERFACE_LIBRARY:
        // An interface library has no file on which to depend.
        // This was listed to get the target-level dependency.
      case cmStateEnums::UTILITY:
      case cmStateEnums::GLOBAL_TARGET:
        // A utility target has no file on which to depend.  This was listed
        // only to get the target-level dependency.
        return false;
    }
  }

  // The name was not that of a CMake target.  It must name a file.
  if (cmSystemTools::FileIsFullPath(inName)) {
    // This is a full path.  Return it as given.
    dep = inName;
    return true;
  }

  // Check for a source file in this directory that matches the
  // dependency.
  if (cmSourceFile* sf = this->Makefile->GetSource(inName)) {
    dep = sf->ResolveFullPath();
    return true;
  }

  // Treat the name as relative to the source directory in which it
  // was given.
  dep = cmStrCat(this->GetCurrentSourceDirectory(), '/', inName);

  // If the in-source path does not exist, assume it instead lives in the
  // binary directory.
  if (!cmSystemTools::FileExists(dep)) {
    dep = cmStrCat(this->GetCurrentBinaryDirectory(), '/', inName);
  }

  dep = cmSystemTools::CollapseFullPath(dep, this->GetBinaryDirectory());

  return true;
}